

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O2

void __thiscall ProblemAloha::ConstructActions(ProblemAloha *this)

{
  MADPComponentDiscreteActions *this_00;
  Index AI;
  ulong uVar1;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  this_00 = &(this->super_FactoredDecPOMDPDiscrete).
             super_MultiAgentDecisionProcessDiscreteFactoredStates._m_A;
  uVar1 = 0;
  while (AI = (Index)uVar1,
        uVar1 < (this->super_FactoredDecPOMDPDiscrete).
                super_MultiAgentDecisionProcessDiscreteFactoredStates.
                super_MultiAgentDecisionProcess._m_nrAgents) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"send",&local_72);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Attempt to send a packet",&local_71);
    MADPComponentDiscreteActions::AddAction(this_00,AI,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"idle",&local_72);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Do nothing, remain idle",&local_71);
    MADPComponentDiscreteActions::AddAction(this_00,AI,&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    uVar1 = (ulong)(AI + 1);
  }
  return;
}

Assistant:

void ProblemAloha::ConstructActions()
{
    for(Index agentIndex=0; agentIndex < _m_nrAgents; agentIndex++)
    {
//         _m_nrActions.push_back(2);
//         _m_actionVecs.push_back(vector<ActionDiscrete>() );
        if(SEND==0) // make sure we add them in the correct order
        {
            AddAction(agentIndex,"send","Attempt to send a packet");
            AddAction(agentIndex,"idle","Do nothing, remain idle");
        }
        else
        {
            AddAction(agentIndex,"send","Attempt to send a packet");
            AddAction(agentIndex,"idle","Do nothing, remain idle");
        }

    }
}